

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utScaleProcess.cpp
# Opt level: O3

void __thiscall
Assimp::UnitTest::utScaleProcess_createTest_Test::~utScaleProcess_createTest_Test
          (utScaleProcess_createTest_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F( utScaleProcess, createTest ) {
    bool ok = true;
    try {
        ScaleProcess process;
    } catch ( ... ) {
        ok = false;
    }
    EXPECT_TRUE( ok );
}